

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<char> *this,unsigned_long_long value,FormatSpec spec)

{
  long lVar1;
  undefined4 uVar2;
  lconv *plVar3;
  size_t __n;
  byte *pbVar4;
  CharPtr pcVar5;
  byte bVar6;
  char *pcVar7;
  unsigned_long_long uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  char in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar16;
  
  uVar2 = spec._20_4_;
  uVar16 = 0;
  uVar10 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar6 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar6 = 0x20;
    }
    uVar16 = (uint)bVar6;
    uVar10 = 1;
  }
  spec._20_4_ = uVar2;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0015276a;
      if (spec.type_ != 'B') goto code_r0x0015291a;
    }
    else {
      if (spec.type_ == 'X') {
LAB_001526ec:
        uVar16 = uVar10;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffa4)[uVar10] = 0x30;
          uVar16 = uVar10 | 2;
          (&stack0xffffffffffffffa5)[uVar10] = spec.type_;
        }
        uVar10 = 0;
        uVar8 = value;
        do {
          uVar10 = uVar10 + 1;
          bVar15 = 0xf < uVar8;
          uVar8 = uVar8 >> 4;
        } while (bVar15);
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar10,&spec,&stack0xffffffffffffffa4,uVar16);
        pcVar7 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar7 = "0123456789abcdef";
        }
        do {
          *pcVar5 = pcVar7[(uint)value & 0xf];
          pcVar5 = pcVar5 + -1;
          bVar15 = 0xf < value;
          value = value >> 4;
        } while (bVar15);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0015291a;
    }
    uVar16 = uVar10;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      (&stack0xffffffffffffffa4)[uVar10] = 0x30;
      uVar16 = uVar10 | 2;
      (&stack0xffffffffffffffa5)[uVar10] = spec.type_;
    }
    uVar10 = 0;
    uVar8 = value;
    do {
      uVar10 = uVar10 + 1;
      bVar15 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar15);
    pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                               (this,uVar10,&spec,&stack0xffffffffffffffa4,uVar16);
    do {
      *pbVar4 = (byte)value & 1 | 0x30;
      pbVar4 = pbVar4 + -1;
      bVar15 = 1 < value;
      value = value >> 1;
    } while (bVar15);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar12 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          (&stack0xffffffffffffffa4)[uVar12] = 0x30;
        }
        uVar16 = 0;
        uVar8 = value;
        do {
          uVar16 = uVar16 + 1;
          bVar15 = 7 < uVar8;
          uVar8 = uVar8 >> 3;
        } while (bVar15);
        pbVar4 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar16,&spec,&stack0xffffffffffffffa4,uVar10);
        do {
          *pbVar4 = (byte)value & 7 | 0x30;
          pbVar4 = pbVar4 + -1;
          bVar15 = 7 < value;
          value = value >> 3;
        } while (bVar15);
        return;
      }
      if (spec.type_ == 'x') goto LAB_001526ec;
code_r0x0015291a:
      internal::report_unknown_type
                (in_stack_ffffffffffffff9f,(char *)CONCAT44(uVar16,in_stack_ffffffffffffffa0));
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        lVar1 = 0x3f;
        if ((value | 1) != 0) {
          for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar16 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
        plVar3 = localeconv();
        pcVar7 = plVar3->thousands_sep;
        __n = strlen(pcVar7);
        uVar16 = uVar16 - (value < *(ulong *)(internal::BasicData<void>::POWERS_OF_10_64 +
                                             (ulong)uVar16 * 8));
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar16 + (int)__n * (uVar16 / 3) + 1,&spec,&stack0xffffffffffffffa4
                            ,uVar10);
        pcVar5 = pcVar5 + 1;
        if (value < 100) {
          bVar15 = false;
        }
        else {
          iVar9 = -1;
          uVar14 = 1;
          iVar11 = -2;
          uVar12 = 2;
          uVar8 = value;
          do {
            value = uVar8 / 100;
            uVar13 = (ulong)(uint)(((int)uVar8 + (int)value * -100) * 2);
            pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar13 + 1];
            pcVar5 = pcVar5 + -1;
            if (((int)(uVar14 / 3) * 3 + iVar9 == 0) && (pcVar5 = pcVar5 + -__n, __n != 0)) {
              memmove(pcVar5,pcVar7,__n);
            }
            pcVar5[-1] = internal::BasicData<void>::DIGITS[uVar13];
            pcVar5 = pcVar5 + -1;
            if (((int)(uVar12 / 3) * 3 + iVar11 == 0) && (pcVar5 = pcVar5 + -__n, __n != 0)) {
              memmove(pcVar5,pcVar7,__n);
            }
            iVar9 = iVar9 + -2;
            uVar10 = (int)uVar14 + 2;
            uVar14 = (ulong)uVar10;
            iVar11 = iVar11 + -2;
            uVar12 = (ulong)((int)uVar12 + 2);
            bVar15 = 9999 < uVar8;
            uVar8 = value;
          } while (bVar15);
          bVar15 = iVar9 + (uVar10 / 3) * 3 == 0;
        }
        if (value < 10) {
          pcVar5[-1] = (byte)value | 0x30;
          return;
        }
        pcVar5[-1] = internal::BasicData<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
        pcVar5 = pcVar5 + -1;
        if ((bVar15) && (pcVar5 = pcVar5 + -__n, __n != 0)) {
          memmove(pcVar5,pcVar7,__n);
        }
        pcVar5[-1] = internal::BasicData<void>::DIGITS[value * 2 & 0x1fffffffe];
        return;
      }
      goto code_r0x0015291a;
    }
LAB_0015276a:
    lVar1 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar16 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar16 - (value < *(ulong *)(internal::BasicData<void>::
                                                           POWERS_OF_10_64 + (ulong)uVar16 * 8))) +
                             1,&spec,&stack0xffffffffffffffa4,uVar10);
    pcVar5 = pcVar5 + 1;
    uVar12 = value;
    if (99 < value) {
      do {
        value = uVar12 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (internal::BasicData<void>::DIGITS +
              (ulong)(uint)((int)uVar12 + (int)value * -100) * 2);
        pcVar5 = pcVar5 + -2;
        bVar15 = 9999 < uVar12;
        uVar12 = value;
      } while (bVar15);
    }
    if (value < 10) {
      pcVar5[-1] = (byte)value | 0x30;
    }
    else {
      pcVar5[-1] = internal::BasicData<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
      pcVar5[-2] = internal::BasicData<void>::DIGITS[value * 2 & 0x1fffffffe];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec)
{
    unsigned prefix_size = 0;
    typedef typename internal::IntTraits<T>::MainType UnsignedType;
    UnsignedType abs_value = static_cast<UnsignedType>(value);
    char prefix[4] = "";
    if (internal::is_negative(value))
    {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
    }
    else if (spec.flag(SIGN_FLAG))
    {
        prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
    }
    switch (spec.type())
    {
    case 0:
    case 'd':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0);
        break;
    }
    case 'x':
    case 'X':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 4) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        const char *digits = spec.type() == 'x' ? "0123456789abcdef" : "0123456789ABCDEF";
        do
        {
            *p-- = digits[n & 0xf];
        } while ((n >>= 4) != 0);
        break;
    }
    case 'b':
    case 'B':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
        {
            prefix[prefix_size++] = '0';
            prefix[prefix_size++] = spec.type_prefix();
        }
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 1) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 1));
        } while ((n >>= 1) != 0);
        break;
    }
    case 'o':
    {
        UnsignedType n = abs_value;
        if (spec.flag(HASH_FLAG))
            prefix[prefix_size++] = '0';
        unsigned num_digits = 0;
        do
        {
            ++num_digits;
        } while ((n >>= 3) != 0);
        Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
        n = abs_value;
        do
        {
            *p-- = static_cast<Char>('0' + (n & 7));
        } while ((n >>= 3) != 0);
        break;
    }
    case 'n':
    {
        unsigned num_digits = internal::count_digits(abs_value);
        fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
        sep = internal::thousands_sep(std::localeconv());
#endif
        unsigned size = static_cast<unsigned>(num_digits + sep.size() * ((num_digits - 1) / 3));
        CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
        internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
        break;
    }
    default:
        internal::report_unknown_type(spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
        break;
    }
}